

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestChild::~TestChild(TestChild *this)

{
  bool bVar1;
  int iVar2;
  __pid_t _Var3;
  anon_union_4_1_a8c68091_for_NullableValue<int>_2 *paVar4;
  Fault f;
  int status;
  
  bVar1 = (this->pid).ptr.isSet;
  paVar4 = (anon_union_4_1_a8c68091_for_NullableValue<int>_2 *)0x0;
  if (bVar1 != false) {
    paVar4 = &(this->pid).ptr.field_1;
  }
  if (bVar1 == true) {
    do {
      iVar2 = ::kill(paVar4->value,9);
      if (-1 < iVar2) goto LAB_001cf529;
      iVar2 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 == 0) {
LAB_001cf529:
      do {
        _Var3 = waitpid(paVar4->value,&status,0);
        if (-1 < _Var3) goto LAB_001cf5b1;
        iVar2 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar2 == -1);
      if (iVar2 != 0) {
        kj::_::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x36a,iVar2,"waitpid(p, &status, 0)","");
        kj::_::Debug::Fault::~Fault(&f);
      }
    }
    else {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x368,iVar2,"::kill(p, SIGKILL)","");
      kj::_::Debug::Fault::~Fault(&f);
    }
  }
LAB_001cf5b1:
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&this->promise);
  return;
}

Assistant:

~TestChild() noexcept(false) {
    KJ_IF_SOME(p, pid) {
      KJ_SYSCALL(::kill(p, SIGKILL)) { return; }
      int status;
      KJ_SYSCALL(waitpid(p, &status, 0)) { return; }
    }
  }